

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

Type * __thiscall
soul::AST::TypeMetaFunction::getSourceType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  int iVar1;
  EndpointDeclaration *pEVar2;
  EndpointDetails *this_00;
  Expression *pEVar3;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  pool_ptr<soul::AST::EndpointDeclaration> local_70;
  vector<soul::Type,_std::allocator<soul::Type>_> local_68;
  CompileMessage local_50;
  
  pEVar3 = (this->source).object;
  if (pEVar3->kind == type) {
    iVar1 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar3);
    pEVar3 = (this->source).object;
    if ((char)iVar1 != '\0') {
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[5])(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_70);
  if (local_70.object == (EndpointDeclaration *)0x0) {
    (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])
              (__return_storage_ptr__);
  }
  else {
    pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_70);
    this_00 = pool_ptr<soul::AST::EndpointDetails>::operator*(&pEVar2->details);
    EndpointDetails::getResolvedDataTypes(&local_68,this_00);
    if ((long)local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_start != 0x18) {
      Errors::endpointHasMultipleTypes<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_50,false);
    }
    Type::Type(__return_storage_ptr__,
               local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Type getSourceType() const
        {
            if (isResolvedAsType (source.get()))
                return source->resolveAsType();

            if (auto endpoint = source->getAsEndpoint())
            {
                auto types = endpoint->getDetails().getResolvedDataTypes();

                if (types.size() == 1)
                    return types.front();

                context.throwError (Errors::endpointHasMultipleTypes());
            }

            return source->getResultType();
        }